

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O2

void cv_delfini(EditLine *el)

{
  wchar_t **ppwVar1;
  wchar_t wVar2;
  ulong uVar3;
  ulong uVar4;
  wchar_t *__src;
  wchar_t *__dest;
  wchar_t num;
  
  wVar2 = (el->el_chared).c_vcmd.action;
  if ((wVar2 & 2U) != 0) {
    (el->el_map).current = (el->el_map).key;
  }
  __src = (el->el_chared).c_vcmd.pos;
  if (__src != (wchar_t *)0x0) {
    uVar4 = (ulong)((long)(el->el_line).cursor - (long)__src) >> 2;
    uVar3 = 1;
    if (1 < (uint)uVar4) {
      uVar3 = uVar4;
    }
    uVar4 = uVar3 & 0xffffffff;
    (el->el_line).cursor = __src;
    num = (wchar_t)uVar3;
    if ((wVar2 & 4U) == 0) {
      if (num < L'\x01') {
        c_delbefore(el,-num);
        ppwVar1 = &(el->el_line).cursor;
        *ppwVar1 = *ppwVar1 + num;
      }
      else {
        c_delafter(el,num);
        re_refresh_cursor(el);
      }
    }
    else {
      if (num < L'\x01') {
        __src = __src + num;
        uVar4 = (ulong)(uint)-num;
        __dest = (el->el_chared).c_kill.buf;
      }
      else {
        __dest = (el->el_chared).c_kill.buf;
      }
      memcpy(__dest,__src,uVar4 * 4);
      (el->el_chared).c_kill.last = (el->el_chared).c_kill.buf + uVar4;
    }
    (el->el_chared).c_vcmd.action = L'\0';
  }
  return;
}

Assistant:

libedit_private void
cv_delfini(EditLine *el)
{
	int size;
	int action = el->el_chared.c_vcmd.action;

	if (action & INSERT)
		el->el_map.current = el->el_map.key;

	if (el->el_chared.c_vcmd.pos == 0)
		/* sanity */
		return;

	size = (int)(el->el_line.cursor - el->el_chared.c_vcmd.pos);
	if (size == 0)
		size = 1;
	el->el_line.cursor = el->el_chared.c_vcmd.pos;
	if (action & YANK) {
		if (size > 0)
			cv_yank(el, el->el_line.cursor, size);
		else
			cv_yank(el, el->el_line.cursor + size, -size);
	} else {
		if (size > 0) {
			c_delafter(el, size);
			re_refresh_cursor(el);
		} else  {
			c_delbefore(el, -size);
			el->el_line.cursor += size;
		}
	}
	el->el_chared.c_vcmd.action = NOP;
}